

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

void __thiscall
wasm::OptimizeInstructions::visitStructGet(OptimizeInstructions *this,StructGet *curr)

{
  Expression **input;
  ulong uVar1;
  Shareability SVar2;
  HeapType local_28;
  
  input = &curr->ref;
  skipNonNullCast(this,input,(Expression *)curr);
  trapOnNull(this,(Expression *)curr,input);
  if ((curr->order == AcqRel) && (uVar1 = ((*input)->type).id, (uVar1 & 1) == 0 && 6 < uVar1)) {
    local_28 = wasm::Type::getHeapType(&(*input)->type);
    SVar2 = HeapType::getShared(&local_28);
    if (SVar2 != Shared) {
      curr->order = Unordered;
    }
  }
  return;
}

Assistant:

void visitStructGet(StructGet* curr) {
    skipNonNullCast(curr->ref, curr);
    trapOnNull(curr, curr->ref);
    // Relax acquire loads of unshared fields to unordered because they cannot
    // synchronize with other threads.
    if (curr->order == MemoryOrder::AcqRel && curr->ref->type.isRef() &&
        !curr->ref->type.getHeapType().isShared()) {
      curr->order = MemoryOrder::Unordered;
    }
  }